

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result wabt::ValidateScript(Script *script,Errors *errors,ValidateOptions *options)

{
  pointer puVar1;
  Command *pCVar2;
  Action *action;
  _func_int **pp_Var3;
  pointer pTVar4;
  char *in_R8;
  _func_int **pp_Var5;
  unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *command;
  pointer puVar6;
  ActionResult AVar7;
  ScriptValidator validator;
  Validator module_validator;
  ScriptValidator local_2e8;
  anon_union_8_2_516a9242_for_ActionResult_2 local_2c8;
  TypeVector local_2c0;
  Validator local_2a8;
  
  local_2e8.result_.enum_ = Ok;
  puVar6 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8.options_ = options;
  local_2e8.errors_ = errors;
  local_2e8.script_ = script;
  if (puVar6 == puVar1) {
    local_2e8.result_.enum_ = Ok;
  }
  else {
    do {
      pCVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      switch(pCVar2->type) {
      case First:
        local_2a8.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_001e3368;
        local_2a8.options_ = local_2e8.options_;
        local_2a8.errors_ = local_2e8.errors_;
        SharedValidator::SharedValidator(&local_2a8.validator_,local_2e8.errors_,local_2e8.options_)
        ;
        local_2a8.result_.enum_ = Ok;
        local_2a8.current_module_ = (Module *)(pCVar2 + 1);
        anon_unknown_4::Validator::CheckModule(&local_2a8);
        local_2a8.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_001e3368;
        SharedValidator::~SharedValidator(&local_2a8.validator_);
        break;
      case Action:
      case AssertTrap:
      case AssertExhaustion:
        anon_unknown_4::ScriptValidator::CheckAction(&local_2e8,(Action *)pCVar2[1]._vptr_Command);
        break;
      case AssertReturn:
        action = (Action *)pCVar2[1]._vptr_Command;
        AVar7 = anon_unknown_4::ScriptValidator::CheckAction(&local_2e8,action);
        local_2c8 = AVar7.field_1;
        local_2a8.super_Delegate._vptr_Delegate = (_func_int **)0x0;
        local_2a8.options_ = (ValidateOptions *)0x0;
        local_2a8.errors_ = (Errors *)0x0;
        pp_Var3 = pCVar2[2]._vptr_Command;
        for (pp_Var5 = *(_func_int ***)&pCVar2[1].type; pp_Var5 != pp_Var3; pp_Var5 = pp_Var5 + 9) {
          local_2c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_2c0.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start._4_4_,*(Enum *)(pp_Var5 + 4));
          if ((Errors *)local_2a8.options_ == local_2a8.errors_) {
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_realloc_insert<wabt::Type>
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_2a8,
                       (iterator)local_2a8.options_,(Type *)&local_2c0);
          }
          else {
            *(Enum *)&(local_2a8.options_)->features = *(Enum *)(pp_Var5 + 4);
            local_2a8.options_ = (ValidateOptions *)((long)local_2a8.options_ + 4);
          }
        }
        if (AVar7.kind == Types) {
          anon_unknown_4::ScriptValidator::CheckResultTypes
                    (&local_2e8,&action->loc,(TypeVector *)&local_2a8,local_2c8.types,in_R8);
        }
        else if (AVar7.kind == Type) {
          pTVar4 = (pointer)operator_new(4);
          local_2c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = pTVar4 + 1;
          pTVar4->enum_ = local_2c8.type.enum_.enum_;
          local_2c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start = pTVar4;
          local_2c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_2c0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
          anon_unknown_4::ScriptValidator::CheckResultTypes
                    (&local_2e8,&action->loc,(TypeVector *)&local_2a8,&local_2c0,in_R8);
          operator_delete(pTVar4);
        }
        if (local_2a8.super_Delegate._vptr_Delegate != (_func_int **)0x0) {
          operator_delete(local_2a8.super_Delegate._vptr_Delegate);
        }
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  return (Result)local_2e8.result_.enum_;
}

Assistant:

ScriptValidator::ScriptValidator(Errors* errors,
                                 const Script* script,
                                 const ValidateOptions& options)
    : options_(options), errors_(errors), script_(script) {}